

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::StackScriptFunction::BoxState::BoxState
          (BoxState *this,ArenaAllocator *alloc,FunctionBody *functionBody,
          ScriptContext *scriptContext,void *returnAddress)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionBody *this_00;
  FunctionInfo *this_01;
  bool local_d1;
  ScriptContext *local_d0;
  FunctionInfo *functionInfo;
  FunctionProxy *nested;
  ScriptContext *pSStack_48;
  uint i;
  FunctionBody *current;
  void *local_30;
  void *returnAddress_local;
  ScriptContext *scriptContext_local;
  FunctionBody *functionBody_local;
  ArenaAllocator *alloc_local;
  BoxState *this_local;
  
  local_30 = returnAddress;
  returnAddress_local = scriptContext;
  scriptContext_local = (ScriptContext *)functionBody;
  functionBody_local = (FunctionBody *)alloc;
  alloc_local = (ArenaAllocator *)this;
  JsUtil::
  BaseHashSet<Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->frameToBox,alloc,0);
  JsUtil::
  BaseHashSet<Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionProxy_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->functionObjectToBox,(AllocatorType *)functionBody_local,0);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->boxedValues,(AllocatorType *)functionBody_local,0);
  this->scriptContext = (ScriptContext *)returnAddress_local;
  this->returnAddress = local_30;
  bVar3 = ParseableFunctionInfo::DoStackNestedFunc((ParseableFunctionInfo *)scriptContext_local);
  if ((!bVar3) ||
     (uVar4 = ParseableFunctionInfo::GetNestedCount((ParseableFunctionInfo *)scriptContext_local),
     uVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x70,
                                "(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0)"
                                ,
                                "functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSStack_48 = scriptContext_local;
  do {
    JsUtil::
    BaseHashSet<Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Add(&this->frameToBox,(FunctionBody **)&stack0xffffffffffffffb8);
    for (nested._4_4_ = 0; uVar2 = nested._4_4_,
        uVar4 = ParseableFunctionInfo::GetNestedCount((ParseableFunctionInfo *)pSStack_48),
        uVar2 < uVar4; nested._4_4_ = nested._4_4_ + 1) {
      functionInfo = (FunctionInfo *)
                     ParseableFunctionInfo::GetNestedFunctionProxy
                               ((ParseableFunctionInfo *)pSStack_48,nested._4_4_);
      JsUtil::
      BaseHashSet<Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionProxy_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add(&this->functionObjectToBox,(FunctionProxy **)&functionInfo);
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)functionInfo);
      if (bVar3) {
        this_00 = FunctionProxy::GetFunctionBody((FunctionProxy *)functionInfo);
        FunctionBody::ClearStackNestedFuncParent(this_00);
      }
    }
    this_01 = FunctionBody::GetAndClearStackNestedFuncParent((FunctionBody *)pSStack_48);
    if (this_01 == (FunctionInfo *)0x0) {
      local_d0 = (ScriptContext *)0x0;
    }
    else {
      local_d0 = (ScriptContext *)FunctionInfo::GetFunctionBody(this_01);
    }
    pSStack_48 = local_d0;
    local_d1 = false;
    if (local_d0 != (ScriptContext *)0x0) {
      local_d1 = ParseableFunctionInfo::DoStackNestedFunc((ParseableFunctionInfo *)local_d0);
    }
  } while (local_d1 != false);
  return;
}

Assistant:

StackScriptFunction::BoxState::BoxState(ArenaAllocator * alloc, FunctionBody * functionBody, ScriptContext * scriptContext, void * returnAddress) :
        frameToBox(alloc), functionObjectToBox(alloc), boxedValues(alloc), scriptContext(scriptContext), returnAddress(returnAddress)
    {
        Assert(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0);
        FunctionBody * current = functionBody;
        do
        {
            frameToBox.Add(current);

            for (uint i = 0; i < current->GetNestedCount(); i++)
            {
                FunctionProxy * nested = current->GetNestedFunctionProxy(i);
                functionObjectToBox.Add(nested);
                if (nested->IsFunctionBody())
                {
                    nested->GetFunctionBody()->ClearStackNestedFuncParent();
                }
            }
            FunctionInfo * functionInfo = current->GetAndClearStackNestedFuncParent();
            current = functionInfo ? functionInfo->GetFunctionBody() : nullptr;
        }
        while (current && current->DoStackNestedFunc());
    }